

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_object(parser *this,lexer *l,size_t nesting_depth)

{
  _func_int **st;
  token_type tVar1;
  token_type tVar2;
  reader *this_00;
  token *ptVar3;
  json_parser_exception *pjVar4;
  string *s;
  size_t sVar5;
  bool bVar6;
  _func_int **in_RCX;
  bool bVar7;
  
  if ((l->m_token)._vptr_token < in_RCX) {
    pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    st = (l->m_token)._vptr_token;
    sVar5 = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception
              (pjVar4,maximum_nesting_depth_exceeded_e,(size_t)st,sVar5);
    __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
  }
  this_00 = (reader *)operator_new(0x58);
  json::json((json *)this_00,object_e);
  this->m_reader = this_00;
  ptVar3 = lexer::next((lexer *)nesting_depth);
  tVar1 = token::get_type(ptVar3);
  if (tVar1 != end_object_e) {
    lexer::put_back_last((lexer *)nesting_depth);
    bVar7 = false;
    do {
      parse_name_value_pair
                ((parser *)l,(lexer *)nesting_depth,
                 (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this,(size_t)in_RCX);
      ptVar3 = lexer::next((lexer *)nesting_depth);
      tVar1 = token::get_type(ptVar3);
      bVar6 = true;
      if ((tVar1 != end_object_e) &&
         (tVar2 = token::get_type(ptVar3), bVar6 = bVar7, tVar2 != value_separator_e)) {
        pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        s = token::get_raw_value_abi_cxx11_(ptVar3);
        sVar5 = reader::get_byte_index((reader *)l->_vptr_lexer);
        json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,s,sVar5);
        __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
      }
      bVar7 = bVar6;
    } while (tVar1 != end_object_e);
    if (!bVar6) {
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
                ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this);
    }
  }
  return (unique_ptr<argo::json,_std::default_delete<argo::json>_>)this;
}

Assistant:

unique_ptr<json> parser::parse_object(lexer &l, size_t nesting_depth)
{
    if (nesting_depth > m_max_nesting_depth)
    {
        throw json_parser_exception(
                            json_parser_exception::maximum_nesting_depth_exceeded_e,
                            m_max_nesting_depth,
                            m_reader.get_byte_index());
    }

    unique_ptr<json> object = unique_ptr<json>(new json(json::object_e));

    const token &t1 = l.next();

    // check for empty object
    if (t1.get_type() == token::end_object_e)
    {
        return object;
    }
    else
    {
        l.put_back_last();
    }

    while (true)
    {
        parse_name_value_pair(l, object, nesting_depth);

        const token &t2 = l.next();

        if (t2.get_type() == token::end_object_e)
        {
            return object;
        }
        else if (t2.get_type() == token::value_separator_e)
        {
            continue;
        }
        else
        {
            throw json_parser_exception(
                        json_parser_exception::unexpected_token_e,
                        t2.get_raw_value(),
                        m_reader.get_byte_index());
        }
    }

    return object;
}